

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MinefieldStatePdu.cpp
# Opt level: O1

void __thiscall DIS::MinefieldStatePdu::marshal(MinefieldStatePdu *this,DataStream *dataStream)

{
  pointer pPVar1;
  pointer pEVar2;
  long lVar3;
  ulong uVar4;
  Point x;
  EntityType local_40;
  
  MinefieldFamilyPdu::marshal(&this->super_MinefieldFamilyPdu,dataStream);
  EntityID::marshal(&this->_minefieldID,dataStream);
  DataStream::operator<<(dataStream,this->_minefieldSequence);
  DataStream::operator<<(dataStream,this->_forceID);
  DataStream::operator<<
            (dataStream,
             (uchar)((uint)(*(int *)&(this->_perimeterPoints).
                                     super__Vector_base<DIS::Point,_std::allocator<DIS::Point>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                           *(int *)&(this->_perimeterPoints).
                                    super__Vector_base<DIS::Point,_std::allocator<DIS::Point>_>.
                                    _M_impl.super__Vector_impl_data._M_start) >> 4));
  EntityType::marshal(&this->_minefieldType,dataStream);
  DataStream::operator<<
            (dataStream,
             (unsigned_short)
             ((uint)(*(int *)&(this->_mineType).
                              super__Vector_base<DIS::EntityType,_std::allocator<DIS::EntityType>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                    *(int *)&(this->_mineType).
                             super__Vector_base<DIS::EntityType,_std::allocator<DIS::EntityType>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 4));
  Vector3Double::marshal(&this->_minefieldLocation,dataStream);
  Orientation::marshal(&this->_minefieldOrientation,dataStream);
  DataStream::operator<<(dataStream,this->_appearance);
  DataStream::operator<<(dataStream,this->_protocolMode);
  pPVar1 = (this->_perimeterPoints).super__Vector_base<DIS::Point,_std::allocator<DIS::Point>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->_perimeterPoints).super__Vector_base<DIS::Point,_std::allocator<DIS::Point>_>._M_impl.
      super__Vector_impl_data._M_finish != pPVar1) {
    lVar3 = 8;
    uVar4 = 0;
    do {
      local_40._vptr_EntityType = (_func_int **)&PTR__Point_001a0b18;
      local_40._8_8_ = *(undefined8 *)((long)&pPVar1->_vptr_Point + lVar3);
      Point::marshal((Point *)&local_40,dataStream);
      Point::~Point((Point *)&local_40);
      uVar4 = uVar4 + 1;
      pPVar1 = (this->_perimeterPoints).super__Vector_base<DIS::Point,_std::allocator<DIS::Point>_>.
               _M_impl.super__Vector_impl_data._M_start;
      lVar3 = lVar3 + 0x10;
    } while (uVar4 < (ulong)((long)(this->_perimeterPoints).
                                   super__Vector_base<DIS::Point,_std::allocator<DIS::Point>_>.
                                   _M_impl.super__Vector_impl_data._M_finish - (long)pPVar1 >> 4));
  }
  pEVar2 = (this->_mineType).super__Vector_base<DIS::EntityType,_std::allocator<DIS::EntityType>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->_mineType).super__Vector_base<DIS::EntityType,_std::allocator<DIS::EntityType>_>.
      _M_impl.super__Vector_impl_data._M_finish != pEVar2) {
    lVar3 = 8;
    uVar4 = 0;
    do {
      local_40._vptr_EntityType = (_func_int **)&PTR__EntityType_0019fe40;
      local_40._8_8_ = *(undefined8 *)((long)&pEVar2->_vptr_EntityType + lVar3);
      EntityType::marshal(&local_40,dataStream);
      EntityType::~EntityType(&local_40);
      uVar4 = uVar4 + 1;
      pEVar2 = (this->_mineType).
               super__Vector_base<DIS::EntityType,_std::allocator<DIS::EntityType>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar3 = lVar3 + 0x10;
    } while (uVar4 < (ulong)((long)(this->_mineType).
                                   super__Vector_base<DIS::EntityType,_std::allocator<DIS::EntityType>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar2 >> 4));
  }
  return;
}

Assistant:

void MinefieldStatePdu::marshal(DataStream& dataStream) const
{
    MinefieldFamilyPdu::marshal(dataStream); // Marshal information in superclass first
    _minefieldID.marshal(dataStream);
    dataStream << _minefieldSequence;
    dataStream << _forceID;
    dataStream << ( unsigned char )_perimeterPoints.size();
    _minefieldType.marshal(dataStream);
    dataStream << ( unsigned short )_mineType.size();
    _minefieldLocation.marshal(dataStream);
    _minefieldOrientation.marshal(dataStream);
    dataStream << _appearance;
    dataStream << _protocolMode;

     for(size_t idx = 0; idx < _perimeterPoints.size(); idx++)
     {
        Point x = _perimeterPoints[idx];
        x.marshal(dataStream);
     }


     for(size_t idx = 0; idx < _mineType.size(); idx++)
     {
        EntityType x = _mineType[idx];
        x.marshal(dataStream);
     }

}